

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O3

nls_object nls_init(int M,int N)

{
  nls_object pnVar1;
  double dVar2;
  
  pnVar1 = (nls_object)malloc((long)N * 8 + 0x58);
  dVar2 = macheps();
  pnVar1->eps = dVar2;
  pnVar1->epsfcn = dVar2;
  pnVar1->factor = 100.0;
  pnVar1->xtol = dVar2;
  dVar2 = pow(dVar2,0.3333333333333333);
  pnVar1->gtol = dVar2;
  pnVar1->ftol = dVar2 * dVar2;
  pnVar1->M = M;
  pnVar1->N = N;
  pnVar1->MaxIter = 1000;
  pnVar1->Maxfev = 1000;
  pnVar1->Iter = 0;
  pnVar1->nfev = 0;
  pnVar1->njev = 0;
  pnVar1->ldfjac = M;
  pnVar1->mode = 1;
  if (0 < N) {
    memset(pnVar1->xopt,0,(ulong)(uint)N << 3);
  }
  return pnVar1;
}

Assistant:

nls_object nls_init(int M,int N) {
	nls_object obj = NULL;
	int i;
	double meps;

	obj = (nls_object) malloc (sizeof(struct nls_set) + sizeof(double)* (N-1));

	meps = macheps();
	obj->eps = meps;
	obj->epsfcn = meps;
	obj->factor = 100.; //Takes values between 0.1 and 100.0
	obj->xtol = meps;
	obj->gtol = pow(meps,(double)1.0/3.0);
	obj->ftol = obj->gtol * obj->gtol;
	obj->M = M;
	obj->N = N;
	obj->MaxIter = 1000;
	obj->Maxfev = 1000;
	obj->nfev = 0;
	obj->njev = 0;
	obj->ldfjac = M;
	obj->mode = 1;

	if (obj->MaxIter < 1000) {
		obj->MaxIter = 1000;
	}

	obj->Iter = 0;
	for (i = 0; i < N;++i) {
		obj->xopt[i] = 0.0;
	}

	return obj;
}